

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocationpool.h
# Opt level: O2

Node * __thiscall
rengine::AllocationPool<rengine::Node>::allocate(AllocationPool<rengine::Node> *this)

{
  uint uVar1;
  Node *pNVar2;
  uint *puVar3;
  char *__assertion;
  
  uVar1 = this->m_nextFree;
  if (uVar1 < this->m_poolSize) {
    pNVar2 = this->m_memory;
    if (pNVar2 == (Node *)0x0) {
      __assertion = "m_memory";
      uVar1 = 0x40;
    }
    else {
      puVar3 = this->m_free;
      if (puVar3 == (uint *)0x0) {
        __assertion = "m_free";
        uVar1 = 0x41;
      }
      else {
        if (puVar3[uVar1] < this->m_poolSize) {
          this->m_nextFree = uVar1 + 1;
          uVar1 = puVar3[uVar1];
          pNVar2[uVar1].super_SignalEmitter.m_buckets =
               (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
                *)0x0;
          pNVar2[uVar1].super_SignalEmitter._vptr_SignalEmitter = (_func_int **)&PTR__Node_001169b0;
          pNVar2[uVar1].m_parent = (Node *)0x0;
          (&pNVar2[uVar1].m_parent)[1] = (Node *)0x0;
          pNVar2[uVar1].m_next = (Node *)0x0;
          (&pNVar2[uVar1].m_next)[1] = (Node *)0x0;
          *(uint *)&pNVar2[uVar1].field_0x30 = *(uint *)&pNVar2[uVar1].field_0x30 & 0xfffff800;
          return pNVar2 + uVar1;
        }
        __assertion = "m_free[m_nextFree] < m_poolSize";
        uVar1 = 0x42;
      }
    }
  }
  else {
    __assertion = "!isExhausted()";
    uVar1 = 0x3f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                ,uVar1,"T *rengine::AllocationPool<rengine::Node>::allocate() [T = rengine::Node]");
}

Assistant:

T *allocate() {
        assert(!isExhausted());
        assert(m_memory);
        assert(m_free);
        assert(m_free[m_nextFree] < m_poolSize);

        // std::cout << "AllocationPool::allocate: memory=" << m_memory
        //           << ", free=" << m_free
        //           << ", nextFree=" << m_nextFree
        //           << ", free[nextFree]=" << m_free[m_nextFree] << std::endl;

        T *t = m_memory + m_free[m_nextFree++];
        // std::cout << " --> t=" << (void *) t
        //           << ", nextFree=" << m_nextFree
        //           << ", free[nextFree]=" << m_free[m_nextFree] << std::endl;

        return new (t) T();
    }